

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O1

Fraig_Node_t * Abc_NtkToFraigExdc(Fraig_Man_t *pMan,Abc_Ntk_t *pNtkMain,Abc_Ntk_t *pNtkExdc)

{
  uint uVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong uVar4;
  int iVar5;
  Abc_Ntk_t *pNtk;
  Fraig_Node_t *pFVar6;
  Abc_Obj_t *pAVar7;
  char **__ptr;
  char *pcVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  long lVar11;
  
  pNtk = Abc_NtkStrash(pNtkExdc,0,0,0);
  Abc_NtkCleanCopy(pNtk);
  pFVar6 = Fraig_ManReadConst1(pMan);
  pAVar7 = Abc_AigConst1(pNtk);
  (pAVar7->field_6).pCopy = (Abc_Obj_t *)pFVar6;
  __ptr = Abc_NtkCollectCioNames(pNtkMain,0);
  pVVar9 = pNtk->vCis;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      pAVar7 = (Abc_Obj_t *)pVVar9->pArray[lVar11];
      if (0 < pNtkMain->vCis->nSize) {
        lVar10 = 0;
        do {
          pcVar8 = Abc_ObjName(pAVar7);
          iVar5 = strcmp(pcVar8,__ptr[lVar10]);
          if (iVar5 == 0) {
            pFVar6 = Fraig_ManReadIthVar(pMan,(int)lVar10);
            (pAVar7->field_6).pCopy = (Abc_Obj_t *)pFVar6;
            break;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < pNtkMain->vCis->nSize);
      }
      if ((pAVar7->field_6).pTemp == (void *)0x0) {
        __assert_fail("pObj->pCopy != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                      ,0xb9,
                      "Fraig_Node_t *Abc_NtkToFraigExdc(Fraig_Man_t *, Abc_Ntk_t *, Abc_Ntk_t *)");
      }
      lVar11 = lVar11 + 1;
      pVVar9 = pNtk->vCis;
    } while (lVar11 < pVVar9->nSize);
  }
  if (__ptr != (char **)0x0) {
    free(__ptr);
  }
  pVVar9 = pNtk->vObjs;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      puVar2 = (undefined8 *)pVVar9->pArray[lVar11];
      if (puVar2 != (undefined8 *)0x0) {
        if (((ulong)puVar2 & 1) != 0) {
          pcVar8 = "!Abc_ObjIsComplement(pNode)";
LAB_0025763d:
          __assert_fail(pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                        ,0x18e,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if (*(int *)*puVar2 != 3) {
          pcVar8 = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_0025763d;
        }
        if (*(int *)((long)puVar2 + 0x1c) == 2) {
          lVar10 = *(long *)(*(long *)((int *)*puVar2 + 8) + 8);
          pFVar6 = Fraig_NodeAnd(pMan,(Fraig_Node_t *)
                                      ((ulong)(*(uint *)((long)puVar2 + 0x14) >> 10 & 1) ^
                                      *(ulong *)(*(long *)(lVar10 + (long)*(int *)puVar2[4] * 8) +
                                                0x40)),
                                 (Fraig_Node_t *)
                                 ((ulong)(*(uint *)((long)puVar2 + 0x14) >> 0xb & 1) ^
                                 *(ulong *)(*(long *)(lVar10 + (long)((int *)puVar2[4])[1] * 8) +
                                           0x40)));
          puVar2[8] = pFVar6;
        }
      }
      lVar11 = lVar11 + 1;
      pVVar9 = pNtk->vObjs;
    } while (lVar11 < pVVar9->nSize);
  }
  if (pNtk->vPos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  plVar3 = (long *)*pNtk->vPos->pArray;
  uVar1 = *(uint *)((long)plVar3 + 0x14);
  uVar4 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                              (long)*(int *)plVar3[4] * 8) + 0x40);
  Abc_NtkDelete(pNtk);
  return (Fraig_Node_t *)(uVar1 >> 10 & 1 ^ uVar4);
}

Assistant:

Fraig_Node_t * Abc_NtkToFraigExdc( Fraig_Man_t * pMan, Abc_Ntk_t * pNtkMain, Abc_Ntk_t * pNtkExdc )
{
    Abc_Ntk_t * pNtkStrash;
    Abc_Obj_t * pObj;
    Fraig_Node_t * gResult;
    char ** ppNames;
    int i, k;
    // strash the EXDC network
    pNtkStrash = Abc_NtkStrash( pNtkExdc, 0, 0, 0 );
    Abc_NtkCleanCopy( pNtkStrash );
    Abc_AigConst1(pNtkStrash)->pCopy = (Abc_Obj_t *)Fraig_ManReadConst1(pMan);
    // set the mapping of the PI nodes
    ppNames = Abc_NtkCollectCioNames( pNtkMain, 0 );
    Abc_NtkForEachCi( pNtkStrash, pObj, i )
    {
        for ( k = 0; k < Abc_NtkCiNum(pNtkMain); k++ )
            if ( strcmp( Abc_ObjName(pObj), ppNames[k] ) == 0 )
            {
                pObj->pCopy = (Abc_Obj_t *)Fraig_ManReadIthVar(pMan, k);
                break;
            }
        assert( pObj->pCopy != NULL );
    }
    ABC_FREE( ppNames );
    // build FRAIG for each node
    Abc_AigForEachAnd( pNtkStrash, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Fraig_NodeAnd( pMan, 
                Fraig_NotCond( Abc_ObjFanin0(pObj)->pCopy, (int)Abc_ObjFaninC0(pObj) ),
                Fraig_NotCond( Abc_ObjFanin1(pObj)->pCopy, (int)Abc_ObjFaninC1(pObj) ) );
    // get the EXDC to be returned
    pObj = Abc_NtkPo( pNtkStrash, 0 );
    gResult = Fraig_NotCond( Abc_ObjFanin0(pObj)->pCopy, (int)Abc_ObjFaninC0(pObj) );
    Abc_NtkDelete( pNtkStrash );
    return gResult;
}